

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::useConfigData(Session *this,ConfigData *configData)

{
  ConfigData *in_RSI;
  ConfigData *in_RDI;
  __shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  
  ConfigData::operator=(in_RSI,in_RDI);
  clara::std::__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>::reset(unaff_retaddr);
  return;
}

Assistant:

void Session::useConfigData( ConfigData const& configData ) {
        m_configData = configData;
        m_config.reset();
    }